

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

GCtab * lj_lib_checktabornil(lua_State *L,int narg)

{
  TValue *pTVar1;
  int iVar2;
  
  pTVar1 = L->base + 1;
  if (pTVar1 < L->top) {
    iVar2 = *(int *)((long)L->base + 0xc);
    if (iVar2 == -1) {
      return (GCtab *)0x0;
    }
    if (iVar2 == -0xc) {
      return (GCtab *)(ulong)(pTVar1->u32).lo;
    }
  }
  lj_err_arg(L,2,LJ_ERR_NOTABN);
}

Assistant:

GCtab *lj_lib_checktabornil(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (tvistab(o))
      return tabV(o);
    else if (tvisnil(o))
      return NULL;
  }
  lj_err_arg(L, narg, LJ_ERR_NOTABN);
  return NULL;  /* unreachable */
}